

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O3

bool __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::solve
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,ColVectorType *b,Heuristic heuristic
          )

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  long *plVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  bool bVar8;
  undefined8 uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Index IVar13;
  Index index;
  ulong uVar14;
  char *__function;
  long lVar15;
  ulong uVar16;
  long lVar17;
  Index unaff_RBX;
  long lVar18;
  long lVar19;
  Index size;
  Scalar SVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  assign_op<float,_float> local_55;
  Heuristic local_54;
  DenseStorage<float,__1,__1,_1,_0> *local_50;
  RowVectorType *local_48;
  Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>
  local_40;
  
  this->_num_ls = 0;
  local_50 = (DenseStorage<float,__1,__1,_1,_0> *)&this->_x;
  lVar17 = (this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  if (lVar17 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, 1>]"
                 );
  }
  if (lVar17 != 0) {
    memset((((RowVectorType *)local_50)->
           super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar17 << 2);
  }
  auVar12 = _DAT_0018f1b0;
  auVar11 = _DAT_0018f010;
  lVar17 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows;
  if (0 < lVar17) {
    plVar4 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    lVar15 = lVar17 + -1;
    auVar22._8_4_ = (int)lVar15;
    auVar22._0_8_ = lVar15;
    auVar22._12_4_ = (int)((ulong)lVar15 >> 0x20);
    uVar16 = 0;
    auVar22 = auVar22 ^ _DAT_0018f010;
    auVar23 = _DAT_0018f150;
    do {
      auVar25 = auVar23 ^ auVar11;
      if ((bool)(~(auVar25._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar25._0_4_ ||
                  auVar22._4_4_ < auVar25._4_4_) & 1)) {
        plVar4[uVar16] = uVar16;
      }
      if ((auVar25._12_4_ != auVar22._12_4_ || auVar25._8_4_ <= auVar22._8_4_) &&
          auVar25._12_4_ <= auVar22._12_4_) {
        plVar4[uVar16 + 1] = uVar16 + 1;
      }
      uVar16 = uVar16 + 2;
      lVar15 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + auVar12._0_8_;
      auVar23._8_8_ = lVar15 + auVar12._8_8_;
    } while ((lVar17 + 1U & 0xfffffffffffffffe) != uVar16);
  }
  this->_Np = 0;
  if ((this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_rows !=
      (b->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Product.h"
                  ,0x62,
                  "Eigen::Product<Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, Eigen::Matrix<float, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<float, -1, -1>>, Rhs = Eigen::Matrix<float, -1, 1>, Option = 0]"
                 );
  }
  local_40.m_lhs.m_matrix = &this->_A;
  local_40.m_rhs = b;
  internal::
  call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<float,float>>
            (&this->_Atb,&local_40,&local_55,(type)0x0);
  _updateGradient(this);
  if ((this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols !=
      this->_Np) {
    local_48 = &this->_w;
    local_54 = heuristic;
    do {
      SVar20 = _max_Z(this,local_48);
      if (SVar20 < this->_epsilon) {
        return true;
      }
      if (heuristic == MAX_DESCENT) {
        IVar13 = _argmax_Z(this,local_48);
        _addToP(this,IVar13);
      }
      while( true ) {
        if ((0 < this->_max_iter) && (this->_max_iter <= this->_num_ls)) {
          return false;
        }
        _solveLS_P(this,b);
        lVar17 = this->_Np;
        if (lVar17 < 1) break;
        lVar15 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        if (lVar15 < 1) {
          lVar15 = 0;
        }
        bVar10 = true;
        fVar21 = 3.4028235e+38;
        lVar19 = 0;
        do {
          if (lVar15 == lVar19) goto LAB_0016e504;
          lVar18 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data[lVar19];
          if ((lVar18 < 0) ||
             ((this->_y).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows <= lVar18)) goto LAB_0016e4ed;
          fVar24 = (this->_y).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[lVar18];
          if (fVar24 < 0.0) {
            if ((this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows <= lVar18) goto LAB_0016e4ed;
            fVar3 = (this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[lVar18];
            fVar24 = (float)((uint)fVar3 ^ (uint)DAT_0018f010) / (fVar24 - fVar3);
            bVar8 = fVar21 <= fVar24;
            IVar13 = lVar19;
            if (fVar21 <= fVar24) {
              fVar24 = fVar21;
              IVar13 = unaff_RBX;
            }
            unaff_RBX = IVar13;
            bVar10 = (bool)(bVar10 & bVar8);
            fVar21 = fVar24;
          }
          lVar19 = lVar19 + 1;
        } while (lVar17 != lVar19);
        if (bVar10) break;
        if (0 < lVar17) {
          lVar15 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>
                   .m_storage.m_rows;
          plVar4 = (this->_P).m_indices.super_PlainObjectBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data;
          pfVar5 = (this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          lVar19 = (this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          pfVar6 = (this->_y).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          if (lVar15 < 1) {
            lVar15 = 0;
          }
          lVar18 = 0;
          do {
            if (lVar15 == lVar18) goto LAB_0016e504;
            lVar7 = plVar4[lVar18];
            if (((lVar7 < 0) ||
                ((this->_y).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows <= lVar7)) || (lVar19 <= lVar7)) goto LAB_0016e4ed;
            fVar24 = pfVar5[lVar7];
            pfVar5[lVar7] = (pfVar6[lVar7] - fVar24) * fVar21 + fVar24;
            lVar18 = lVar18 + 1;
          } while (lVar17 != lVar18);
        }
        _remFromP(this,unaff_RBX);
      }
      pfVar5 = (this->_y).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      uVar16 = (this->_y).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      if ((this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != uVar16) {
        if ((long)uVar16 < 0) {
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                        ,0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, 1>]"
                       );
        }
        DenseStorage<float,_-1,_-1,_1,_0>::resize(local_50,uVar16,uVar16,1);
        if ((this->_x).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != uVar16) {
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                        ,0x2fd,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, 1>, SrcXprType = Eigen::Matrix<float, -1, 1>, T1 = float, T2 = float]"
                       );
        }
      }
      heuristic = local_54;
      pfVar6 = (((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&local_50->m_data)->
               m_storage).m_data;
      uVar14 = uVar16 + 3;
      if (-1 < (long)uVar16) {
        uVar14 = uVar16;
      }
      uVar14 = uVar14 & 0xfffffffffffffffc;
      if (3 < (long)uVar16) {
        lVar17 = 0;
        do {
          pfVar2 = pfVar5 + lVar17;
          uVar9 = *(undefined8 *)(pfVar2 + 2);
          pfVar1 = pfVar6 + lVar17;
          *(undefined8 *)pfVar1 = *(undefined8 *)pfVar2;
          *(undefined8 *)(pfVar1 + 2) = uVar9;
          lVar17 = lVar17 + 4;
        } while (lVar17 < (long)uVar14);
      }
      if ((long)uVar14 < (long)uVar16) {
        do {
          pfVar6[uVar14] = pfVar5[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar16 != uVar14);
      }
      _updateGradient(this);
    } while ((this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols != this->_Np);
  }
  return true;
LAB_0016e504:
  __function = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<long, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<long, -1, 1>, Level = 1]"
  ;
  goto LAB_0016e519;
LAB_0016e4ed:
  __function = 
  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<float, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<float, -1, 1>, Level = 1]"
  ;
LAB_0016e519:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x1ab,__function);
}

Assistant:

bool NNLS<MatrixType>::solve(const ColVectorType &b, Heuristic heuristic)
{
#ifdef EIGEN3_NNLS_DEBUG
  std::cerr << "NNLS(): Start..." << std::endl;
  _QR.setZero(); _qrCoeffs.setZero();
#endif

  // Initialize solver
  _num_ls = 0; _x.setZero();

  // Together with _Np, P separates the space of coefficients into a active (Z) and passive (P)
  // set. The first _Np elements form the passive set P and the remaining elements form the
  // active set Z.
  _P.setIdentity(); _Np = 0;

  // Precompute A^T*b
  _Atb = _A.transpose() * b;

  // OUTER LOOP
  while (true)
  {
    // Update gradient _w
    _updateGradient();

    // Check if system is solved:
    if ((_A.cols()==_Np) || ((_max_Z(_w)-_epsilon)<0))
      return true;

    switch (heuristic) {
    // find index of max descent and add it to P
    case MAX_DESCENT:
        _addToP(_argmax_Z(_w));
        break;
    }

    // INNER LOOP
    while (true)
    {
      // Check if max. number of iterations is reached
      if ( (0 < _max_iter) && (int(_num_ls) >= _max_iter) )
        return false;

      // Solve LS problem in P only, this step is rather trivial as _addToP & _remFromP
      // updates the QR decomposition of A^P.
      _solveLS_P(b);

      // Check feasability...
      bool feasable = true;
      Scalar alpha = std::numeric_limits<Scalar>::max(); Index remIdx;
      for (Index i=0; i<_Np; i++) {
        Index idx = _P.indices()(i);
        if (_y(idx) < 0) {
          // t shoudl always be in [0,1].
          Scalar t = -_x(idx)/(_y(idx)-_x(idx));
          if (alpha > t) {
            alpha = t;
            remIdx = i;
            feasable = false;
          }
        }
      }

      // If solution is feasable, exit to outer loop
      if (feasable) {
        _x = _y;
        break;
      }

      // Infeasable solution -> interpolate to feasable one
      for (Index i=0; i<_Np; i++) {
        Index idx = _P.indices()(i);
        _x(idx) += alpha * (_y(idx) - _x(idx));
      }

      // Remove these indices from P and update QR decomposition
      _remFromP(remIdx);
    }
  }
}